

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.c
# Opt level: O2

void delete_scope(Scope *scope)

{
  if (FUNCTION_PROTOTYPE_SCOPE < scope->type) {
    if (scope->type == FUNCTION_SCOPE) {
      delete_function_scope((Function_Scope *)scope);
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GTSimeonov[P]IOPL_Project/src/semantics/identifiers/scope.c"
                  ,0x41,"void delete_scope(struct Scope *)");
  }
  Map_Map((Map *)(scope + 1),delete_denoted_wrapper);
  Map_Destroy((Map *)(scope + 1));
  Map_Map((Map *)(scope + 0x82),delete_denoted_with_no_linkage_wrapper);
  Map_Destroy((Map *)(scope + 0x82));
  free(scope);
  return;
}

Assistant:

void delete_scope(struct Scope *scope)
{
	switch(scope->type)
	{
		case BLOCK_SCOPE:
		case FILE_SCOPE:
		case FUNCTION_PROTOTYPE_SCOPE:
			delete_normal_scope((struct Normal_Scope*)scope);
			break;
		case FUNCTION_SCOPE:
			delete_function_scope((struct Function_Scope*)scope);
		default:
			assert(0);
	}
}